

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::divide(DoubleAPFloat *this,DoubleAPFloat *RHS,roundingMode RM)

{
  opStatus oVar1;
  undefined1 local_a8 [32];
  DoubleAPFloat local_88;
  APFloat local_78;
  opStatus local_54;
  undefined1 local_50 [4];
  opStatus Ret;
  undefined1 local_40 [8];
  APFloat Tmp;
  roundingMode RM_local;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  Tmp.U._20_4_ = RM;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x102b,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::divide(const DoubleAPFloat &, APFloat::roundingMode)"
                 );
  }
  bitcastToAPInt((DoubleAPFloat *)local_50);
  APFloat::APFloat((APFloat *)local_40,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)local_50);
  APInt::~APInt((APInt *)local_50);
  bitcastToAPInt(&local_88);
  APFloat::APFloat(&local_78,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_88);
  oVar1 = APFloat::divide((APFloat *)local_40,&local_78,Tmp.U._20_4_);
  APFloat::~APFloat(&local_78);
  APInt::~APInt((APInt *)&local_88);
  local_54 = oVar1;
  APFloat::bitcastToAPInt((APFloat *)local_a8);
  DoubleAPFloat((DoubleAPFloat *)(local_a8 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                (APInt *)local_a8);
  operator=(this,(DoubleAPFloat *)(local_a8 + 0x10));
  ~DoubleAPFloat((DoubleAPFloat *)(local_a8 + 0x10));
  APInt::~APInt((APInt *)local_a8);
  oVar1 = local_54;
  APFloat::~APFloat((APFloat *)local_40);
  return oVar1;
}

Assistant:

APFloat::opStatus DoubleAPFloat::divide(const DoubleAPFloat &RHS,
                                        APFloat::roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret =
      Tmp.divide(APFloat(semPPCDoubleDoubleLegacy, RHS.bitcastToAPInt()), RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}